

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O0

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  long *this_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  iterator end;
  ulong uVar5;
  reference pvVar6;
  pointer pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  cmExecutionStatus local_43c;
  uint local_438;
  cmExecutionStatus status;
  uint t;
  uint j_2;
  cmListFileArgument arg;
  __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_3f8;
  iterator k;
  undefined1 local_3e8 [4];
  uint c;
  cmListFileFunction newLFF;
  value_type local_380;
  uint local_35c;
  char local_358 [4];
  uint j_1;
  char argvName [60];
  undefined1 local_310 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  uint local_2b4;
  undefined1 local_2b0 [4];
  uint j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  string expandedArgv;
  Range<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_268;
  undefined1 local_258 [8];
  string expandedArgn;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  const_iterator eit;
  string argcDef;
  ostringstream argcDefStream;
  undefined1 local_88 [8];
  MacroPushPop macroScope;
  undefined1 local_70 [8];
  string errorMsg;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmMacroHelperCommand *this_local;
  
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)inStatus;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  cmMakefile::ExpandArguments
            ((this->super_cmCommand).Makefile,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,(char *)0x0);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Args);
  if (sVar2 < sVar3 - 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_70,"Macro invoked with incorrect arguments for macro named: ",
               (allocator *)&macroScope.field_0xf);
    std::allocator<char>::~allocator((allocator<char> *)&macroScope.field_0xf);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->Args,0);
    std::__cxx11::string::operator+=((string *)local_70,(string *)pvVar4);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_70);
    this_local._7_1_ = false;
    macroScope.ReportError = true;
    macroScope._9_3_ = 0;
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              ((MacroPushPop *)local_88,(this->super_cmCommand).Makefile,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(argcDef.field_2._M_local_buf + 8));
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    std::ostream::operator<<((void *)((long)&argcDef.field_2 + 8),sVar2);
    std::__cxx11::ostringstream::str();
    expandedArgn.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Args);
    local_230 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&expandedArgn.field_2 + 8),sVar2 - 1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_228,&local_230);
    end = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
    local_268 = cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_228,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )end._M_current);
    cmJoin<ContainerAlgorithms::Range<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_258,&local_268,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)
               &variables.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40,";");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b0);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Args);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b0,sVar2 - 1);
    local_2b4 = 1;
    while( true ) {
      uVar5 = (ulong)local_2b4;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Args);
      if (sVar2 <= uVar5) break;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->Args,(ulong)local_2b4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &argVs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"${",pvVar4);
      std::operator+(&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &argVs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"}");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b0,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string
                ((string *)
                 &argVs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_2b4 = local_2b4 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_310);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_310,sVar2);
    local_35c = 0;
    while( true ) {
      uVar5 = (ulong)local_35c;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if (sVar2 <= uVar5) break;
      sprintf(local_358,"${ARGV%i}",(ulong)local_35c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_380,local_358,
                 (allocator *)
                 ((long)&newLFF.Arguments.
                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_310,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&newLFF.Arguments.
                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_35c = local_35c + 1;
    }
    cmListFileFunction::cmListFileFunction((cmListFileFunction *)local_3e8);
    k._M_current._4_4_ = 0;
    while( true ) {
      uVar5 = (ulong)k._M_current._4_4_;
      sVar2 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                        (&this->Functions);
      if (sVar2 <= uVar5) break;
      this_00 = &newLFF.super_cmListFileContext.Line;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this_00);
      pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                         (&this->Functions,(ulong)k._M_current._4_4_);
      sVar2 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size
                        (&pvVar6->Arguments);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this_00,sVar2);
      pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                         (&this->Functions,(ulong)k._M_current._4_4_);
      std::__cxx11::string::operator=((string *)local_3e8,(string *)pvVar6);
      pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                         (&this->Functions,(ulong)k._M_current._4_4_);
      std::__cxx11::string::operator=
                ((string *)(newLFF.super_cmListFileContext.Name.field_2._M_local_buf + 8),
                 (string *)&(pvVar6->super_cmListFileContext).FilePath);
      pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                         (&this->Functions,(ulong)k._M_current._4_4_);
      newLFF.super_cmListFileContext.FilePath.field_2._8_8_ = (pvVar6->super_cmListFileContext).Line
      ;
      pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                         (&this->Functions,(ulong)k._M_current._4_4_);
      local_3f8._M_current =
           (cmListFileArgument *)
           std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin
                     (&pvVar6->Arguments);
      while( true ) {
        pvVar6 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                           (&this->Functions,(ulong)k._M_current._4_4_);
        arg.Line = (long)std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end
                                   (&pvVar6->Arguments);
        bVar1 = __gnu_cxx::operator!=
                          (&local_3f8,
                           (__normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                            *)&arg.Line);
        if (!bVar1) break;
        cmListFileArgument::cmListFileArgument((cmListFileArgument *)&t);
        pcVar7 = __gnu_cxx::
                 __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                 ::operator->(&local_3f8);
        std::__cxx11::string::operator=((string *)&t,(string *)pcVar7);
        pcVar7 = __gnu_cxx::
                 __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                 ::operator->(&local_3f8);
        if (pcVar7->Delim != Bracket) {
          status.ReturnInvoked = false;
          status.BreakInvoked = false;
          status.ContinueInvoked = false;
          status.NestedError = false;
          while( true ) {
            uVar5 = (ulong)(uint)status;
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2b0);
            if (sVar2 <= uVar5) break;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2b0,(ulong)(uint)status);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40,(ulong)(uint)status);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString((string *)&t,pcVar8,pcVar9);
            status = (cmExecutionStatus)((int)status + 1);
          }
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::ReplaceString((string *)&t,"${ARGC}",pcVar8);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::ReplaceString((string *)&t,"${ARGN}",pcVar8);
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::ReplaceString((string *)&t,"${ARGV}",pcVar8);
          lVar10 = std::__cxx11::string::find((char *)&t,0x959961);
          if (lVar10 != -1) {
            local_438 = 0;
            while( true ) {
              uVar5 = (ulong)local_438;
              sVar2 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_40);
              if (sVar2 <= uVar5) break;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_310,(ulong)local_438);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_40,(ulong)local_438);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmsys::SystemTools::ReplaceString((string *)&t,pcVar8,pcVar9);
              local_438 = local_438 + 1;
            }
          }
        }
        pcVar7 = __gnu_cxx::
                 __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                 ::operator->(&local_3f8);
        arg.Value.field_2._8_4_ = pcVar7->Delim;
        pcVar7 = __gnu_cxx::
                 __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                 ::operator->(&local_3f8);
        arg._32_8_ = pcVar7->Line;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                   &newLFF.super_cmListFileContext.Line,(value_type *)&t);
        cmListFileArgument::~cmListFileArgument((cmListFileArgument *)&t);
        __gnu_cxx::
        __normal_iterator<cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
        ::operator++(&local_3f8);
      }
      cmExecutionStatus::cmExecutionStatus(&local_43c);
      bVar1 = cmMakefile::ExecuteCommand
                        ((this->super_cmCommand).Makefile,(cmListFileFunction *)local_3e8,&local_43c
                        );
      if (!bVar1) {
LAB_004d5f5a:
        cmMakefile::MacroPushPop::Quiet((MacroPushPop *)local_88);
        cmExecutionStatus::SetNestedError
                  ((cmExecutionStatus *)
                   expandedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
        this_local._7_1_ = false;
        goto LAB_004d6020;
      }
      bVar1 = cmExecutionStatus::GetNestedError(&local_43c);
      if (bVar1) goto LAB_004d5f5a;
      bVar1 = cmExecutionStatus::GetReturnInvoked(&local_43c);
      if (bVar1) {
        cmExecutionStatus::SetReturnInvoked
                  ((cmExecutionStatus *)
                   expandedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
        this_local._7_1_ = true;
        goto LAB_004d6020;
      }
      bVar1 = cmExecutionStatus::GetBreakInvoked(&local_43c);
      if (bVar1) {
        cmExecutionStatus::SetBreakInvoked
                  ((cmExecutionStatus *)
                   expandedArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
        this_local._7_1_ = true;
        goto LAB_004d6020;
      }
      k._M_current._4_4_ = k._M_current._4_4_ + 1;
    }
    this_local._7_1_ = true;
LAB_004d6020:
    macroScope.ReportError = true;
    macroScope._9_3_ = 0;
    cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_3e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_310);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b0);
    std::__cxx11::string::~string
              ((string *)
               &variables.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::string::~string((string *)&eit);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(argcDef.field_2._M_local_buf + 8))
    ;
    cmMakefile::MacroPushPop::~MacroPushPop((MacroPushPop *)local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass
(const std::vector<cmListFileArgument>& args,
 cmExecutionStatus &inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1)
    {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
    }

  cmMakefile::MacroPushPop macroScope(this->Makefile,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit
      = expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j)
    {
    variables.push_back("${" + this->Args[j] + "}");
    }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j)
    {
    sprintf(argvName,"${ARGV%i}",j);
    argVs.push_back(argvName);
    }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for(unsigned int c = 0; c < this->Functions.size(); ++c)
    {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(this->Functions[c].Arguments.size());
    newLFF.Name = this->Functions[c].Name;
    newLFF.FilePath = this->Functions[c].FilePath;
    newLFF.Line = this->Functions[c].Line;

    // for each argument of the current function
    for (std::vector<cmListFileArgument>::iterator k =
           this->Functions[c].Arguments.begin();
         k != this->Functions[c].Arguments.end(); ++k)
      {
      cmListFileArgument arg;
      arg.Value = k->Value;
      if(k->Delim != cmListFileArgument::Bracket)
        {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j)
          {
          cmSystemTools::ReplaceString(arg.Value, variables[j].c_str(),
                                       expandedArgs[j].c_str());
          }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}",argcDef.c_str());

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}",
                                     expandedArgn.c_str());
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}",
                                     expandedArgv.c_str());

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos)
          {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t)
            {
            cmSystemTools::ReplaceString(arg.Value, argVs[t].c_str(),
                                         expandedArgs[t].c_str());
            }
          }
        }
      arg.Delim = k->Delim;
      arg.Line = k->Line;
      newLFF.Arguments.push_back(arg);
      }
    cmExecutionStatus status;
    if(!this->Makefile->ExecuteCommand(newLFF, status) ||
       status.GetNestedError())
      {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError(true);
      return false;
      }
    if (status.GetReturnInvoked())
      {
      inStatus.SetReturnInvoked(true);
      return true;
      }
    if (status.GetBreakInvoked())
      {
      inStatus.SetBreakInvoked(true);
      return true;
      }
    }
  return true;
}